

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void tlb_set_page_with_attrs_riscv64
               (CPUState *cpu,target_ulong vaddr,hwaddr paddr,MemTxAttrs attrs,int prot,int mmu_idx,
               target_ulong size)

{
  undefined4 *puVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  undefined8 *puVar5;
  _func_int_CPUState_ptr_MemTxAttrs_conflict *p_Var6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 uVar14;
  int asidx;
  uint uVar15;
  target_ulong tVar16;
  MemoryRegionSection *section;
  void *pvVar17;
  ram_addr_t rVar18;
  hwaddr hVar19;
  ulong uVar20;
  long *plVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  hwaddr xlat;
  MemTxAttrs in_stack_ffffffffffffff68;
  uint local_84;
  target_ulong local_80;
  hwaddr local_78;
  MemTxAttrs local_6c;
  long local_68;
  long local_60;
  long local_58;
  void *local_50;
  ulong *local_48;
  ulong local_40;
  ulong local_38;
  
  pvVar17 = cpu->env_ptr;
  p_Var6 = cpu->cc->asidx_from_attrs;
  local_84 = prot;
  local_80 = vaddr;
  if (p_Var6 == (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) {
    asidx = 0;
  }
  else {
    asidx = (*p_Var6)((CPUState_conflict *)cpu,in_stack_ffffffffffffff68);
    if ((asidx < 0) || (cpu->num_ases <= asidx)) {
      __assert_fail("ret < cpu->num_ases && ret >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                    ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
    }
  }
  local_58 = (long)pvVar17 + -0xb30;
  local_60 = (long)mmu_idx;
  lVar22 = local_60 * 0x2b8;
  local_48 = (ulong *)((long)pvVar17 + lVar22 + -0xb30);
  local_38 = 0x1000;
  if (0x1000 < size) {
    uVar29 = *local_48;
    uVar20 = -size;
    tVar16 = local_80;
    if (uVar29 != 0xffffffffffffffff) {
      uVar30 = uVar20 & *(ulong *)((long)pvVar17 + lVar22 + -0xb28);
      do {
        uVar20 = uVar30;
        tVar16 = uVar29;
        uVar30 = uVar20 * 2;
      } while ((uVar20 & (uVar29 ^ local_80)) != 0);
    }
    *local_48 = tVar16 & uVar20;
    *(ulong *)((long)pvVar17 + lVar22 + -0xb28) = uVar20;
    local_38 = size;
  }
  local_40 = paddr & 0xfffffffffffff000;
  local_50 = pvVar17;
  section = address_space_translate_for_iotlb_riscv64
                      (cpu,asidx,local_40,&local_78,&local_38,attrs,(int *)&local_84);
  if (0xfff < local_38) {
    uVar20 = local_80 & 0xfffffffffffff000;
    uVar29 = uVar20 | 0x800;
    if (0xfff < size) {
      uVar29 = uVar20;
    }
    uVar29 = (uint)attrs >> 0xc & 0x80 | uVar29;
    local_6c = attrs;
    if (section->mr->ram == true) {
      pvVar17 = memory_region_get_ram_ptr_riscv64((MemoryRegion_conflict *)section->mr);
      local_68 = (long)pvVar17 + local_78;
      rVar18 = memory_region_get_ram_addr_riscv64((MemoryRegion_conflict *)section->mr);
      lVar28 = rVar18 + local_78;
      uVar30 = uVar29;
      if ((local_84 & 2) != 0) {
        if (section->readonly == true) {
          uVar30 = uVar29 | 0x40;
        }
        else {
          uVar30 = uVar29 | 0x400;
        }
      }
    }
    else {
      hVar19 = memory_region_section_get_iotlb_riscv64(cpu,section);
      lVar28 = hVar19 + local_78;
      uVar30 = uVar29 | 0x200;
      local_68 = 0;
      uVar29 = uVar30;
    }
    uVar15 = cpu_watchpoint_address_matches_riscv64(cpu,uVar20,0x1000);
    uVar25 = *(ulong *)((long)local_50 + local_60 * 0x10 + -0x50);
    lVar7 = *(long *)((long)local_50 + local_60 * 0x10 + -0x48);
    *(ushort *)((long)local_50 + -0xb50) =
         *(ushort *)((long)local_50 + -0xb50) | (ushort)(1 << ((byte)local_60 & 0x1f));
    plVar21 = (long *)(local_58 + lVar22 + 0x20);
    lVar26 = 0;
    do {
      if ((((*(ulong *)((long)local_50 + lVar26 + lVar22 + -0xb00) & 0xfffffffffffff800) == uVar20)
          || ((*(ulong *)((long)local_50 + lVar26 + lVar22 + -0xaf8) & 0xfffffffffffff800) == uVar20
             )) || ((*(ulong *)((long)local_50 + lVar26 + lVar22 + -0xaf0) & 0xfffffffffffff800) ==
                    uVar20)) {
        puVar1 = (undefined4 *)((long)local_50 + lVar26 + lVar22 + -0xb00);
        puVar1[0xc] = 0xffffffff;
        puVar1[0xd] = 0xffffffff;
        puVar1[0xe] = 0xffffffff;
        puVar1[0xf] = 0xffffffff;
        puVar1[8] = 0xffffffff;
        puVar1[9] = 0xffffffff;
        puVar1[10] = 0xffffffff;
        puVar1[0xb] = 0xffffffff;
        puVar1[4] = 0xffffffff;
        puVar1[5] = 0xffffffff;
        puVar1[6] = 0xffffffff;
        puVar1[7] = 0xffffffff;
        *puVar1 = 0xffffffff;
        puVar1[1] = 0xffffffff;
        puVar1[2] = 0xffffffff;
        puVar1[3] = 0xffffffff;
        *plVar21 = *plVar21 + -1;
      }
      lVar26 = lVar26 + 0x40;
    } while (lVar26 != 0x200);
    uVar23 = uVar25 >> 6 & local_80 >> 0xc;
    puVar2 = (ulong *)(lVar7 + uVar23 * 0x40);
    uVar25 = *(ulong *)(lVar7 + uVar23 * 0x40);
    if ((((uVar25 & 0xfffffffffffff800) != uVar20) && ((puVar2[1] & 0xfffffffffffff800) != uVar20))
       && (((puVar2[2] & 0xfffffffffffff800) != uVar20 &&
           ((uVar25 & puVar2[1] & puVar2[2]) != 0xffffffffffffffff)))) {
      uVar25 = local_48[5];
      local_48[5] = uVar25 + 1;
      uVar24 = (uint)uVar25 & 7;
      uVar27 = (ulong)(uVar24 << 6);
      uVar25 = *puVar2;
      uVar8 = puVar2[1];
      uVar9 = puVar2[2];
      uVar10 = puVar2[3];
      uVar11 = puVar2[4];
      uVar12 = puVar2[5];
      uVar13 = puVar2[7];
      puVar4 = (ulong *)((long)local_48 + uVar27 + 0x60);
      *puVar4 = puVar2[6];
      puVar4[1] = uVar13;
      puVar4 = (ulong *)((long)local_48 + uVar27 + 0x50);
      *puVar4 = uVar11;
      puVar4[1] = uVar12;
      puVar4 = (ulong *)((long)local_48 + uVar27 + 0x40);
      *puVar4 = uVar9;
      puVar4[1] = uVar10;
      puVar4 = (ulong *)((long)local_48 + uVar27 + 0x30);
      *puVar4 = uVar25;
      puVar4[1] = uVar8;
      puVar3 = (undefined8 *)(local_48[0x56] + (uVar23 & 0xffffffff) * 0x10);
      uVar14 = puVar3[1];
      puVar5 = (undefined8 *)((long)local_48 + (ulong)(uVar24 << 4) + 0x230);
      *puVar5 = *puVar3;
      puVar5[1] = uVar14;
      *plVar21 = *plVar21 + -1;
    }
    uVar25 = local_48[0x56];
    lVar22 = (uVar23 & 0xffffffff) * 0x10;
    *(ulong *)(uVar25 + lVar22) = lVar28 - uVar20;
    *(MemTxAttrs *)(uVar25 + 8 + lVar22) = local_6c;
    uVar25 = 0xffffffffffffffff;
    if ((local_84 & 2) != 0) {
      uVar25 = uVar30 | (uVar15 & 2) << 7 | (ulong)((local_84 & 0x40) << 5);
    }
    *puVar2 = -(ulong)((local_84 & 1) == 0) | (uVar15 & 1) << 8 | uVar29;
    puVar2[1] = uVar25;
    puVar2[2] = -(ulong)((local_84 & 4) == 0) | uVar29;
    puVar2[3] = local_40;
    puVar2[4] = local_68 - uVar20;
    *plVar21 = *plVar21 + 1;
    return;
  }
  __assert_fail("sz >= TARGET_PAGE_SIZE",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                ,0x322,
                "void tlb_set_page_with_attrs_riscv64(CPUState *, target_ulong, hwaddr, MemTxAttrs, int, int, target_ulong)"
               );
}

Assistant:

void tlb_set_page_with_attrs(CPUState *cpu, target_ulong vaddr,
                             hwaddr paddr, MemTxAttrs attrs, int prot,
                             int mmu_idx, target_ulong size)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    CPUArchState *env = cpu->env_ptr;
    CPUTLB *tlb = env_tlb(env);
    CPUTLBDesc *desc = &tlb->d[mmu_idx];
    MemoryRegionSection *section;
    unsigned int index;
    target_ulong address;
    target_ulong write_address;
    uintptr_t addend;
    CPUTLBEntry *te, tn;
    hwaddr iotlb, xlat, sz, paddr_page;
    target_ulong vaddr_page;
    int asidx = cpu_asidx_from_attrs(cpu, attrs);
    int wp_flags;
    bool is_ram;

    // assert_cpu_is_self(cpu);

    if (size <= TARGET_PAGE_SIZE) {
        sz = TARGET_PAGE_SIZE;
    } else {
        tlb_add_large_page(env, mmu_idx, vaddr, size);
        sz = size;
    }
    vaddr_page = vaddr & TARGET_PAGE_MASK;
    paddr_page = paddr & TARGET_PAGE_MASK;

    section = address_space_translate_for_iotlb(cpu, asidx, paddr_page,
                                                &xlat, &sz, attrs, &prot);
    assert(sz >= TARGET_PAGE_SIZE);

    address = vaddr_page;
    if (size < TARGET_PAGE_SIZE) {
        /* Repeat the MMU check and TLB fill on every access.  */
        address |= TLB_INVALID_MASK;
    }
    if (attrs.byte_swap) {
        address |= TLB_BSWAP;
    }

    is_ram = memory_region_is_ram(section->mr);
    // is_romd = memory_region_is_romd(section->mr);

    if (is_ram) {
        /* RAM and ROMD both have associated host memory. */
        addend = (uintptr_t)memory_region_get_ram_ptr(section->mr) + xlat;
    } else {
        /* I/O does not; force the host address to NULL. */
        addend = 0;
    }

    write_address = address;
    if (is_ram) {
        iotlb = memory_region_get_ram_addr(section->mr) + xlat;
        /*
         * Computing is_clean is expensive; avoid all that unless
         * the page is actually writable.
         */
        if (prot & PAGE_WRITE) {
            if (section->readonly) {
                write_address |= TLB_DISCARD_WRITE;
            } else if (cpu_physical_memory_is_clean(iotlb)) {
                write_address |= TLB_NOTDIRTY;
            }
        }
    } else {
        /* I/O or ROMD */
        iotlb = memory_region_section_get_iotlb(cpu, section) + xlat;
        /*
         * Writes to romd devices must go through MMIO to enable write.
         * Reads to romd devices go through the ram_ptr found above,
         * but of course reads to I/O must go through MMIO.
         */
        write_address |= TLB_MMIO;
        //if (!is_romd) {
            address = write_address;
        //}
    }

    wp_flags = cpu_watchpoint_address_matches(cpu, vaddr_page,
                                              TARGET_PAGE_SIZE);

    index = tlb_index(env, mmu_idx, vaddr_page);
    te = tlb_entry(env, mmu_idx, vaddr_page);

    /* Note that the tlb is no longer clean.  */
    tlb->c.dirty |= 1 << mmu_idx;

    /* Make sure there's no cached translation for the new page.  */
    tlb_flush_vtlb_page_locked(env, mmu_idx, vaddr_page);

    /*
     * Only evict the old entry to the victim tlb if it's for a
     * different page; otherwise just overwrite the stale data.
     */
    if (!tlb_hit_page_anyprot(env->uc, te, vaddr_page) && !tlb_entry_is_empty(te)) {
        unsigned vidx = desc->vindex++ % CPU_VTLB_SIZE;
        CPUTLBEntry *tv = &desc->vtable[vidx];

        /* Evict the old entry into the victim tlb.  */
        copy_tlb_helper_locked(tv, te);
        desc->viotlb[vidx] = desc->iotlb[index];
        tlb_n_used_entries_dec(env, mmu_idx);
    }

    /* refill the tlb */
    /*
     * At this point iotlb contains a physical section number in the lower
     * TARGET_PAGE_BITS, and either
     *  + the ram_addr_t of the page base of the target RAM (RAM)
     *  + the offset within section->mr of the page base (I/O, ROMD)
     * We subtract the vaddr_page (which is page aligned and thus won't
     * disturb the low bits) to give an offset which can be added to the
     * (non-page-aligned) vaddr of the eventual memory access to get
     * the MemoryRegion offset for the access. Note that the vaddr we
     * subtract here is that of the page base, and not the same as the
     * vaddr we add back in io_readx()/io_writex()/get_page_addr_code().
     */
    desc->iotlb[index].addr = iotlb - vaddr_page;
    desc->iotlb[index].attrs = attrs;

    /* Now calculate the new entry */
    tn.addend = addend - vaddr_page;
    tn.paddr = paddr_page;
    if (prot & PAGE_READ) {
        tn.addr_read = address;
        if (wp_flags & BP_MEM_READ) {
            tn.addr_read |= TLB_WATCHPOINT;
        }
    } else {
        tn.addr_read = -1;
    }

    if (prot & PAGE_EXEC) {
        tn.addr_code = address;
    } else {
        tn.addr_code = -1;
    }

    tn.addr_write = -1;
    if (prot & PAGE_WRITE) {
        tn.addr_write = write_address;
        if (prot & PAGE_WRITE_INV) {
            tn.addr_write |= TLB_INVALID_MASK;
        }
        if (wp_flags & BP_MEM_WRITE) {
            tn.addr_write |= TLB_WATCHPOINT;
        }
    }

    copy_tlb_helper_locked(te, &tn);
    tlb_n_used_entries_inc(env, mmu_idx);
}